

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clique.cpp
# Opt level: O1

unique_ptr<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>,_std::default_delete<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>_>_>
 __thiscall Clique::getAllAlignments(Clique *this)

{
  vector<AlignmentRecord_const*,std::allocator<AlignmentRecord_const*>> *this_00;
  iterator __position;
  _func_int **pp_Var1;
  size_type pos;
  pointer *__ptr;
  long in_RSI;
  AlignmentRecord *local_30;
  
  pp_Var1 = (_func_int **)operator_new(0x18);
  *pp_Var1 = (_func_int *)0x0;
  pp_Var1[1] = (_func_int *)0x0;
  pp_Var1[2] = (_func_int *)0x0;
  this->_vptr_Clique = pp_Var1;
  pos = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_do_find_from
                  (*(dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> **)
                    (in_RSI + 0x20),0);
  for (; pos != 0xffffffffffffffff;
      pos = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_next
                      (*(dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> **)
                        (in_RSI + 0x20),pos)) {
    this_00 = (vector<AlignmentRecord_const*,std::allocator<AlignmentRecord_const*>> *)
              this->_vptr_Clique;
    local_30 = (AlignmentRecord *)
               (**(code **)(**(long **)(in_RSI + 0x28) + 0x28))(*(long **)(in_RSI + 0x28),pos);
    __position._M_current = *(AlignmentRecord ***)(this_00 + 8);
    if (__position._M_current == *(AlignmentRecord ***)(this_00 + 0x10)) {
      std::vector<AlignmentRecord_const*,std::allocator<AlignmentRecord_const*>>::
      _M_realloc_insert<AlignmentRecord_const*>(this_00,__position,&local_30);
    }
    else {
      *__position._M_current = local_30;
      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
    }
  }
  return (__uniq_ptr_data<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>,_std::default_delete<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>_>,_true,_true>
          )(__uniq_ptr_data<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>,_std::default_delete<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>_>,_true,_true>
            )this;
}

Assistant:

unique_ptr<vector<const AlignmentRecord*> > Clique::getAllAlignments() const {
	unique_ptr<vector<const AlignmentRecord*> > result(new vector<const AlignmentRecord*>());
	for (size_t i=alignment_set->find_first(); i!=alignment_set_t::npos; i=alignment_set->find_next(i)) {
		result->push_back(&parent.getAlignmentByIndex(i));
	}
	return result;
}